

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O1

void __thiscall
TPZBlockDiagonal<double>::AutoFill
          (TPZBlockDiagonal<double> *this,int64_t neq,int64_t jeq,int symmetric)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  int iVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  TPZStack<int,_10> blsizes;
  double local_b0;
  long local_98;
  TPZManVector<int,_10> local_78;
  
  if (neq == jeq) {
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
    if (0 < neq) {
      lVar8 = 0;
      do {
        iVar4 = rand();
        lVar6 = (iVar4 * neq) / 0x7fffffff;
        lVar12 = neq - lVar8;
        if (lVar6 < neq - lVar8) {
          lVar12 = lVar6;
        }
        TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,(int)lVar12);
        lVar8 = lVar8 + lVar12;
      } while (lVar8 < neq);
    }
    Initialize(this,&local_78.super_TPZVec<int>);
    lVar8 = (this->fBlockSize).fNElements;
    if (0 < lVar8) {
      lVar6 = 0;
      do {
        lVar12 = (long)(this->fBlockSize).fStore[lVar6];
        if (0 < lVar12) {
          lVar2 = (this->fBlockPos).fStore[lVar6];
          lVar7 = lVar2 * 8;
          lVar1 = lVar12 * 8;
          lVar10 = 0;
          local_98 = lVar7;
          do {
            if (lVar10 == 0 || symmetric != 1) {
              local_b0 = 0.0;
              lVar9 = 0;
            }
            else {
              pdVar3 = (this->fStorage).fStore;
              puVar5 = (undefined8 *)((long)pdVar3 + lVar7);
              local_b0 = 0.0;
              lVar9 = 0;
              do {
                *puVar5 = *(undefined8 *)((long)pdVar3 + lVar9 * 8 + local_98);
                local_b0 = local_b0 + ABS(*(double *)((long)pdVar3 + lVar9 * 8 + local_98));
                lVar9 = lVar9 + 1;
                puVar5 = puVar5 + lVar12;
              } while (lVar10 != lVar9);
            }
            if (lVar9 < lVar12) {
              lVar11 = lVar1 * lVar9 + lVar7;
              do {
                dVar13 = TPZMatrix<double>::GetRandomVal(&this->super_TPZMatrix<double>);
                *(double *)((long)(this->fStorage).fStore + lVar11) = dVar13;
                if (lVar10 != lVar9) {
                  local_b0 = local_b0 + ABS(dVar13);
                }
                lVar9 = lVar9 + 1;
                lVar11 = lVar11 + lVar1;
              } while (lVar12 != lVar9);
            }
            pdVar3 = (this->fStorage).fStore;
            if (ABS(pdVar3[lVar2 + lVar10 + lVar10 * lVar12]) < local_b0) {
              pdVar3[lVar2 + lVar10 + lVar10 * lVar12] = local_b0 + 1.0;
            }
            lVar10 = lVar10 + 1;
            local_98 = local_98 + lVar1;
            lVar7 = lVar7 + 8;
          } while (lVar10 != lVar12);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar8);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblockdiag.cpp"
             ,0x24f);
}

Assistant:

void TPZBlockDiagonal<TVar>::AutoFill(int64_t neq, int64_t jeq, int symmetric) {
    if (neq != jeq) {
        DebugStop();
    }
    TPZStack<int> blsizes;
    int64_t totalsize = 0;
    while (totalsize < neq) {
        int64_t blsize = (neq*rand())/RAND_MAX;
        blsize = blsize < neq-totalsize ? blsize : neq-totalsize;
        blsizes.Push(blsize);
        totalsize += blsize;
    }
    Initialize(blsizes);
    // Initialize the blocksizes!!
	int64_t b, bsize, eq = 0, pos;
	int64_t nb = fBlockSize.NElements(), r, c;
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(c=0; c<bsize; c++) {
            RTVar sum = 0.;
            r=0;
            if (symmetric == 1) {
                for (r=0; r<c; r++) {
                    fStorage[pos+c+r*bsize]=fStorage[pos+r+c*bsize];
                    sum += fabs(fStorage[pos+r+c*bsize]);
                }
            }
			for(; r<bsize; r++) {
				auto val = this->GetRandomVal();
				fStorage[pos+c+r*bsize] = (val);
                if(c!= r) sum += fabs(val);
			}
            //totototo
//            if(r==4)
//            {
//                std::cout << "sum " << sum << std::endl;
//            }
            if (fabs(fStorage[pos+c+c*bsize]) < sum) {
                fStorage[pos+c+c*bsize] = (TVar)(sum + (RTVar)1.);
            }
		}
		eq += bsize;
	}
}